

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  byte bVar1;
  uint uVar2;
  roaring_array_t *ra;
  container_t *pcVar3;
  ushort *puVar4;
  roaring_bitmap_t *prVar5;
  uint end_index;
  uint uVar6;
  roaring_array_t *prVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint16_t key_00;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_4f;
  uint8_t local_4e;
  uint8_t local_4d;
  uint local_4c;
  roaring_array_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_4d = '\0';
  uVar9 = (x1->high_low_container).size;
  prVar5 = x2;
  if (uVar9 != 0) {
    uVar6 = (x2->high_low_container).size;
    local_40 = (ulong)uVar6;
    prVar5 = x1;
    if (uVar6 != 0) {
      ra = &roaring_bitmap_create_with_capacity(uVar6 + uVar9)->high_low_container;
      bVar1 = 1;
      if (((x1->high_low_container).flags & 1) == 0) {
        bVar1 = (x2->high_low_container).flags & 1;
      }
      ra->flags = ra->flags & 0xfe | bVar1;
      key_00 = *(x1->high_low_container).keys;
      puVar4 = (x2->high_low_container).keys;
      local_4c = 0;
      uVar10 = 0;
      local_48 = &x2->high_low_container;
      local_38 = (ulong)uVar9;
LAB_0010f10c:
      do {
        key = *puVar4;
        uVar10 = (ulong)(int)uVar10;
        while( true ) {
          prVar7 = local_48;
          iVar8 = (int)uVar10;
          if (key_00 == key) break;
          if (key <= key_00) {
            local_4f = local_48->typecodes[(ushort)local_4c];
            pcVar3 = get_copy_of_container
                               (local_48->containers[(ushort)local_4c],&local_4f,
                                (_Bool)(local_48->flags & 1));
            if ((local_48->flags & 1) != 0) {
              local_48->containers[(int)local_4c] = pcVar3;
              local_48->typecodes[(int)local_4c] = local_4f;
            }
            ra_append(ra,key,pcVar3,local_4f);
            uVar2 = local_4c + 1;
            uVar6 = (uint)local_40;
            prVar7 = local_48;
            end_index = uVar6;
            if (uVar2 == uVar6) goto LAB_0010f315;
            puVar4 = (ushort *)((ulong)((uVar2 & 0xffff) * 2) + (long)local_48->keys);
            local_4c = uVar2;
            goto LAB_0010f10c;
          }
          local_4e = (x1->high_low_container).typecodes[uVar10 & 0xffff];
          pcVar3 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar10 & 0xffff],&local_4e,
                              (_Bool)((x1->high_low_container).flags & 1));
          if (((x1->high_low_container).flags & 1) != 0) {
            (x1->high_low_container).containers[uVar10] = pcVar3;
            (x1->high_low_container).typecodes[uVar10] = local_4e;
          }
          ra_append(ra,key_00,pcVar3,local_4e);
          if (uVar9 - 1 == iVar8) {
            end_index = (uint)local_40;
            prVar7 = local_48;
            uVar6 = local_4c;
            goto LAB_0010f2c9;
          }
          uVar10 = uVar10 + 1;
          key_00 = (x1->high_low_container).keys[uVar10 & 0xffff];
        }
        local_4e = (x1->high_low_container).typecodes[uVar10 & 0xffff];
        local_4f = local_48->typecodes[(ushort)local_4c];
        pcVar3 = container_or((x1->high_low_container).containers[uVar10 & 0xffff],local_4e,
                              local_48->containers[(ushort)local_4c],local_4f,&local_4d);
        ra_append(ra,key_00,pcVar3,local_4d);
        uVar6 = local_4c + 1;
        if ((uVar9 - 1 == iVar8) || (uVar6 == (uint)local_40)) {
          uVar10 = (ulong)(iVar8 + 1);
          end_index = (uint)local_40;
LAB_0010f315:
          uVar9 = (uint)uVar10;
          if (uVar9 == (uint)local_38) {
LAB_0010f2c9:
            local_4c = uVar6;
            bVar1 = prVar7->flags;
            x1 = (roaring_bitmap_t *)prVar7;
            uVar9 = local_4c;
          }
          else {
            if (uVar6 != end_index) {
              return (roaring_bitmap_t *)ra;
            }
            bVar1 = (x1->high_low_container).flags;
            end_index = (uint)local_38;
          }
          ra_append_copy_range(ra,&x1->high_low_container,uVar9,end_index,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar10 = uVar10 + 1;
        key_00 = (x1->high_low_container).keys[(uint)uVar10 & 0xffff];
        puVar4 = (ushort *)((ulong)((uVar6 & 0xffff) * 2) + (long)prVar7->keys);
        local_4c = uVar6;
      } while( true );
    }
  }
  prVar5 = roaring_bitmap_copy(prVar5);
  return prVar5;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or(const roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c = container_or(c1, type1, c2, type2, &result_type);

            // since we assume that the initial containers are non-empty, the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            // c1 = container_clone(c1, type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // c2 = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}